

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strcmpfld_s.c
# Opt level: O0

errno_t strcmpfld_s(char *dest,rsize_t dmax,char *src,int *indicator)

{
  long lVar1;
  int *in_RCX;
  char *in_RDX;
  ulong in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  errno_t in_stack_ffffffffffffffcc;
  ulong local_20;
  char *local_18;
  errno_t local_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RCX == (int *)0x0) {
    invoke_safe_str_constraint_handler(in_RDX,(void *)0x0,in_stack_ffffffffffffffcc);
    local_c = 400;
  }
  else {
    *in_RCX = 0;
    if (in_RDI == (char *)0x0) {
      invoke_safe_str_constraint_handler(in_RDX,in_RCX,in_stack_ffffffffffffffcc);
      local_c = 400;
    }
    else if (in_RDX == (char *)0x0) {
      invoke_safe_str_constraint_handler((char *)0x0,in_RCX,in_stack_ffffffffffffffcc);
      local_c = 400;
    }
    else if (in_RSI == 0) {
      invoke_safe_str_constraint_handler(in_RDX,in_RCX,in_stack_ffffffffffffffcc);
      local_c = 0x191;
    }
    else {
      local_20 = in_RSI;
      local_18 = in_RDI;
      if (in_RSI < 0x10000001) {
        for (; (local_20 != 0 && (*local_18 == *in_RDX)); local_18 = local_18 + 1) {
          in_RDX = in_RDX + 1;
          local_20 = local_20 - 1;
        }
        *in_RCX = (int)*local_18 - (int)*in_RDX;
        local_c = 0;
      }
      else {
        invoke_safe_str_constraint_handler(in_RDX,in_RCX,in_stack_ffffffffffffffcc);
        local_c = 0x193;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_c;
}

Assistant:

errno_t
strcmpfld_s (const char *dest, rsize_t dmax,
             const char *src, int *indicator)
{
    if (indicator == NULL) {
        invoke_safe_str_constraint_handler("strcmpfld_s: indicator is null",
                   NULL, ESNULLP);
        return (ESNULLP);
    }
    *indicator = 0;

    if (dest == NULL) {
        invoke_safe_str_constraint_handler("strcmpfld_s: dest is null",
                   NULL, ESNULLP);
        return (ESNULLP);
    }

    if (src == NULL) {
        invoke_safe_str_constraint_handler("strcmpfld_s: src is null",
                   NULL, ESNULLP);
        return (ESNULLP);
    }

    if (dmax == 0) {
        invoke_safe_str_constraint_handler("strcmpfld_s: dmax is 0",
                   NULL, ESZEROL);
        return (ESZEROL);
    }

    if (dmax > RSIZE_MAX_STR) {
        invoke_safe_str_constraint_handler("strcmpfld_s: dmax exceeds max",
                   NULL, ESLEMAX);
        return (ESLEMAX);
    }

    /* compare for dmax charactrers, not the null! */
    while (dmax) {

        if (*dest != *src) {
            break;
        }

        dest++;
        src++;
        dmax--;
    }

    *indicator = *dest - *src;
    return (EOK);
}